

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O0

int genxScrubText(genxWriter w,constUtf8 in,utf8 out)

{
  int iVar1;
  uchar *in_RDX;
  constUtf8 in_RSI;
  genxWriter in_RDI;
  int c;
  constUtf8 last;
  int problems;
  constUtf8 local_28;
  int local_1c;
  uchar *local_18;
  constUtf8 local_10;
  genxWriter local_8;
  
  local_1c = 0;
  local_28 = in_RSI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (*local_10 != '\0') {
    iVar1 = genxNextUnicodeChar(&local_10);
    if (iVar1 == -1) {
      local_1c = local_1c + 1;
      local_28 = local_10;
    }
    else {
      iVar1 = isXMLChar(local_8,iVar1);
      if (iVar1 == 0) {
        local_1c = local_1c + 1;
        local_28 = local_10;
      }
      else {
        while (local_28 < local_10) {
          *local_18 = *local_28;
          local_28 = local_28 + 1;
          local_18 = local_18 + 1;
        }
      }
    }
  }
  *local_18 = '\0';
  return local_1c;
}

Assistant:

int genxScrubText(genxWriter w, constUtf8 in, utf8 out)
{
  int problems = 0;
  constUtf8 last = in;

  while (*in)
  {
    int c = genxNextUnicodeChar(&in);
    if (c == -1)
    {
      problems++;
      last = in;
      continue;
    }

    if (!isXMLChar(w, c))
    {
      problems++;
      last = in;
      continue;
    }

    while (last < in)
      *out++ = *last++;
  }
  *out = 0;
  return problems;
}